

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

uint If_DsdSign_rec(If_DsdMan_t *p,If_DsdObj_t *pObj,int *pnSupp)

{
  int iVar1;
  If_DsdObj_t *pObj_00;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  if ((*(uint *)&pObj->field_0x4 & 7) == 2) {
    iVar1 = *pnSupp;
    *pnSupp = iVar1 + 1;
    uVar3 = 1 << ((char)iVar1 * '\x02' & 0x1fU);
  }
  else {
    uVar3 = 0;
    if (0x7ffffff < *(uint *)&pObj->field_0x4) {
      uVar4 = 0;
      uVar3 = 0;
      do {
        if ((int)(&pObj[1].Id)[uVar4] < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar2 = (&pObj[1].Id)[uVar4] >> 1;
        if ((p->vObjs).nSize <= (int)uVar2) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pObj_00 = (If_DsdObj_t *)(p->vObjs).pArray[uVar2];
        if (pObj_00 == (If_DsdObj_t *)0x0) {
          return uVar3;
        }
        uVar2 = If_DsdSign_rec(p,pObj_00,pnSupp);
        uVar3 = uVar3 | uVar2;
        uVar4 = uVar4 + 1;
      } while (uVar4 < *(uint *)&pObj->field_0x4 >> 0x1b);
    }
  }
  return uVar3;
}

Assistant:

unsigned If_DsdSign_rec( If_DsdMan_t * p, If_DsdObj_t * pObj, int * pnSupp )
{
    unsigned uSign = 0; int i;
    If_DsdObj_t * pFanin;
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
        return (1 << (2*(*pnSupp)++));
    If_DsdObjForEachFanin( &p->vObjs, pObj, pFanin, i )
        uSign |= If_DsdSign_rec( p, pFanin, pnSupp );
    return uSign;
}